

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

void __thiscall
iutest::AssertionHelper::ScopedTrace::append_message
          (ScopedTrace *this,TestPartResult *part_result,bool isException)

{
  bool bVar1;
  undefined7 in_register_00000011;
  _List_node_base *p_Var2;
  allocator<char> local_75;
  undefined4 local_74;
  string local_70 [32];
  string local_50;
  
  local_74 = (undefined4)CONCAT71(in_register_00000011,isException);
  if (((this->list).
       super__List_base<iutest::AssertionHelper::ScopedMessage_*,_std::allocator<iutest::AssertionHelper::ScopedMessage_*>_>
       ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)this) &&
     (bVar1 = detail::UncaughtScopedTrace::Has(), !bVar1)) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"\niutest trace:",(allocator<char> *)&local_50);
  std::__cxx11::string::append((string *)part_result);
  std::__cxx11::string::~string(local_70);
  p_Var2 = (_List_node_base *)this;
  while (p_Var2 = (((msg_list *)&p_Var2->_M_next)->
                  super__List_base<iutest::AssertionHelper::ScopedMessage_*,_std::allocator<iutest::AssertionHelper::ScopedMessage_*>_>
                  )._M_impl._M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)this
        ) {
    std::__cxx11::string::string<std::allocator<char>>(local_70,"\n",(allocator<char> *)&local_50);
    std::__cxx11::string::append((string *)part_result);
    std::__cxx11::string::~string(local_70);
    detail::iuCodeMessage::make_message_abi_cxx11_(&local_50,*(iuCodeMessage **)(p_Var2 + 1));
    std::__cxx11::string::string<std::allocator<char>>(local_70,local_50._M_dataplus._M_p,&local_75)
    ;
    std::__cxx11::string::append((string *)part_result);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((char)local_74 != '\0') {
    detail::UncaughtScopedTrace::Get_abi_cxx11_();
    std::__cxx11::string::append((string *)part_result);
    std::__cxx11::string::~string(local_70);
  }
  return;
}

Assistant:

void append_message(TestPartResult& part_result, bool isException)
        {
            if( !list.empty() || detail::UncaughtScopedTrace::Has() )
            {
                part_result.add_message("\niutest trace:");
                // TODO : 追加メッセージとして保存するべき
                // 現状はテスト結果のメッセージに追加している。
                for( msg_list::iterator it = list.begin(), end=list.end(); it != end; ++it )
                {
                    part_result.add_message("\n");
                    part_result.add_message((*it)->make_message().c_str());
                }
                if( isException )
                {
                    part_result.add_message(detail::UncaughtScopedTrace::Get());
                }
            }
        }